

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_abcd_reg(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  int iVar1;
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 pTVar2;
  TCGContext_conflict2 *pTVar3;
  TCGTemp *pTVar4;
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  uint uVar5;
  
  tcg_ctx = s->uc->tcg_ctx;
  gen_flush_flags(s);
  pTVar2 = tcg_ctx->cpu_dregs[insn & 7];
  pTVar3 = s->uc->tcg_ctx;
  pTVar4 = tcg_temp_new_internal_m68k(pTVar3,TCG_TYPE_I32,false);
  iVar1 = s->release_count;
  if ((long)iVar1 < 8) {
    ret = (TCGv_i32)((long)pTVar4 - (long)pTVar3);
    s->release_count = iVar1 + 1;
    s->release[iVar1] = ret;
    tcg_gen_ext8u_i32_m68k(pTVar3,ret,pTVar2);
    uVar5 = insn >> 9 & 7;
    pTVar2 = tcg_ctx->cpu_dregs[uVar5];
    pTVar3 = s->uc->tcg_ctx;
    pTVar4 = tcg_temp_new_internal_m68k(pTVar3,TCG_TYPE_I32,false);
    iVar1 = s->release_count;
    if ((long)iVar1 < 8) {
      ret_00 = (TCGv_i32)((long)pTVar4 - (long)pTVar3);
      s->release_count = iVar1 + 1;
      s->release[iVar1] = ret_00;
      tcg_gen_ext8u_i32_m68k(pTVar3,ret_00,pTVar2);
      bcd_add(tcg_ctx,ret_00,ret);
      gen_partset_reg(tcg_ctx,0,tcg_ctx->cpu_dregs[uVar5],ret_00);
      bcd_flags(tcg_ctx,ret_00);
      return;
    }
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
             ,0x91,"s->release_count < MAX_TO_RELEASE");
}

Assistant:

DISAS_INSN(abcd_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv dest;

    gen_flush_flags(s); /* !Z is sticky */

    src = gen_extend(s, DREG(insn, 0), OS_BYTE, 0);
    dest = gen_extend(s, DREG(insn, 9), OS_BYTE, 0);
    bcd_add(tcg_ctx, dest, src);
    gen_partset_reg(tcg_ctx, OS_BYTE, DREG(insn, 9), dest);

    bcd_flags(tcg_ctx, dest);
}